

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Payload>
          (CrateReader *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *d)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  size_t i;
  uint64_t n;
  uint32_t _n;
  uint32_t shapesize;
  ostringstream ss_e;
  uint64_t local_1c8;
  uint local_1c0;
  uint32_t local_1bc [9];
  Payload local_198;
  
  if (d == (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)0x0) {
    return false;
  }
  local_1c8 = 0;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar1 = StreamReader::read4(this->_sr,local_1bc);
    if (bVar1) {
      bVar1 = StreamReader::read4(this->_sr,&local_1c0);
      if (bVar1) {
        local_1c8 = (uint64_t)local_1c0;
        goto LAB_001876cf;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      iVar4 = 0x612;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      iVar4 = 0x60d;
    }
  }
  else {
    bVar1 = StreamReader::read8(this->_sr,&local_1c8);
    if (bVar1) {
LAB_001876cf:
      if ((this->_config).maxArrayElements < local_1c8) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
        poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x61d);
        ::std::operator<<(poVar2," ");
        pcVar5 = "Too many array elements.";
      }
      else {
        uVar3 = local_1c8 * 0x120 + this->_memoryUsage;
        this->_memoryUsage = uVar3;
        if (uVar3 <= (this->_config).maxMemoryBudget) {
          uVar3 = 0;
          while( true ) {
            if (local_1c8 <= uVar3) {
              return true;
            }
            Payload::Payload(&local_198);
            bVar1 = ReadPayload(this,&local_198);
            if (!bVar1) break;
            ::std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>::
            emplace_back<tinyusdz::Payload&>
                      ((vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>> *)d,&local_198);
            Payload::~Payload(&local_198);
            uVar3 = uVar3 + 1;
          }
          Payload::~Payload(&local_198);
          return false;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
        poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x620);
        ::std::operator<<(poVar2," ");
        pcVar5 = "Reached to max memory budget.";
      }
      goto LAB_0018797f;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    poVar2 = ::std::operator<<((ostream *)&local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    iVar4 = 0x617;
  }
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar4);
  ::std::operator<<(poVar2," ");
  pcVar5 = "Failed to read the number of array elements.";
LAB_0018797f:
  poVar2 = ::std::operator<<((ostream *)&local_198,pcVar5);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<Payload> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Payload) * n);

  for (size_t i = 0; i < n; i++) {
    Payload p;
    if (!ReadPayload(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}